

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O2

int __thiscall CaDiCaL::Internal::negative_horn_satisfiable(Internal *this)

{
  int64_t *piVar1;
  pointer ppCVar2;
  Clause *pCVar3;
  bool bVar4;
  Clause *__range2;
  int iVar5;
  long lVar6;
  int idx;
  int lit;
  pointer ppCVar7;
  
  ppCVar2 = (this->clauses).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar7 = (this->clauses).
                 super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar7 != ppCVar2; ppCVar7 = ppCVar7 + 1) {
    bVar4 = terminated_asynchronously(this,10);
    if (bVar4) goto LAB_006657ce;
    pCVar3 = *ppCVar7;
    if ((*(ushort *)&pCVar3->field_0x8 & 0x810) == 0) {
      lVar6 = 0;
      do {
        if ((long)pCVar3->size * 4 == lVar6) goto LAB_0066575b;
        iVar5 = *(int *)((long)&pCVar3[1].field_0 + lVar6);
        if ('\0' < this->vals[iVar5]) goto LAB_00665704;
        lVar6 = lVar6 + 4;
      } while (0 < iVar5 || this->vals[iVar5] != '\0');
      if (iVar5 == 0) {
LAB_0066575b:
        if (0 < this->level) {
          backtrack(this,0);
        }
        goto LAB_0066576e;
      }
      search_assume_decision(this,iVar5);
      bVar4 = propagate(this);
      if (!bVar4) goto LAB_0066576e;
    }
LAB_00665704:
  }
  iVar5 = *(this->vars).n;
  lit = 1;
  while( true ) {
    if (lit - iVar5 == 1) {
      if (this->internal != (Internal *)0x0) {
        verbose(this->internal,1,"clauses are negative horn satisfied");
      }
      piVar1 = &(this->stats).lucky.horn.negative;
      *piVar1 = *piVar1 + 1;
      return 10;
    }
    bVar4 = terminated_asynchronously(this,10);
    if (bVar4) break;
    if (this->vals[lit] == '\0') {
      search_assume_decision(this,lit);
      bVar4 = propagate(this);
      if (!bVar4) goto LAB_0066576e;
    }
    lit = lit + 1;
  }
LAB_006657ce:
  iVar5 = -1;
LAB_006657d6:
  unlucky(this,iVar5);
  return iVar5;
LAB_0066576e:
  iVar5 = 0;
  goto LAB_006657d6;
}

Assistant:

int Internal::negative_horn_satisfiable () {
  LOG ("checking that all clauses are negative horn satisfiable");
  assert (!level);
  assert (assumptions.empty ());
  for (const auto &c : clauses) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (c->garbage)
      continue;
    if (c->redundant)
      continue;
    int negative_literal = 0;
    bool satisfied = false;
    for (const auto &lit : *c) {
      const signed char tmp = val (lit);
      if (tmp > 0) {
        satisfied = true;
        break;
      }
      if (tmp < 0)
        continue;
      if (lit > 0)
        continue;
      negative_literal = lit;
      break;
    }
    if (satisfied)
      continue;
    if (!negative_literal) {
      if (level > 0)
        backtrack ();
      LOG (c, "no negative unassigned literal in");
      return unlucky (0);
    }
    assert (negative_literal < 0);
    LOG (c, "found negative literal %d in", negative_literal);
    search_assume_decision (negative_literal);
    if (propagate ())
      continue;
    LOG ("propagation of negative literal %d leads to conflict",
         negative_literal);
    return unlucky (0);
  }
  for (auto idx : vars) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (val (idx))
      continue;
    search_assume_decision (idx);
    if (propagate ())
      continue;
    LOG ("propagation of remaining literal %d leads to conflict", idx);
    return unlucky (0);
  }
  VERBOSE (1, "clauses are negative horn satisfied");
  assert (!conflict);
  assert (satisfied ());
  stats.lucky.horn.negative++;
  return 10;
}